

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

void ELFIO::dump::section_header(ostream *out,Elf_Half no,section *sec,uchar elf_class)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  Elf_Xword flags;
  Elf_Xword flags_00;
  string local_1a8 [35];
  char local_185;
  int local_184;
  char local_17d;
  int local_17c;
  char local_175;
  int local_174;
  char local_16d;
  int local_16c;
  char local_165;
  int local_164;
  char local_15d;
  int local_15c;
  string local_158;
  char local_135;
  int local_134;
  char local_12d;
  int local_12c;
  char local_125;
  int local_124;
  char local_11d;
  int local_11c;
  string local_118;
  char local_f5;
  int local_f4;
  char local_ed;
  int local_ec;
  string local_e8 [35];
  char local_c5;
  int local_c4;
  char local_bd;
  int local_bc;
  char local_b5;
  int local_b4;
  char local_ad;
  int local_ac;
  string local_a8;
  char local_81;
  int local_80;
  char local_79;
  int local_78;
  char local_71;
  int local_70;
  char local_69;
  int local_68;
  string local_58;
  char local_35;
  int local_34;
  char local_2d;
  int local_2c;
  fmtflags local_28;
  uchar local_21;
  fmtflags original_flags;
  uchar elf_class_local;
  section *sec_local;
  ostream *poStack_10;
  Elf_Half no_local;
  ostream *out_local;
  
  local_21 = elf_class;
  _original_flags = sec;
  sec_local._6_2_ = no;
  poStack_10 = out;
  local_28 = std::ios_base::flags((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  if (local_21 == '\x01') {
    poVar3 = std::operator<<(poStack_10,"[");
    local_2c = (int)std::setw(5);
    poVar3 = std::operator<<(poVar3,(_Setw)local_2c);
    local_2d = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_2d);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,sec_local._6_2_);
    poVar3 = std::operator<<(poVar3,"] ");
    local_34 = (int)std::setw(0x11);
    poVar3 = std::operator<<(poVar3,(_Setw)local_34);
    local_35 = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_35);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::left);
    uVar1 = (*_original_flags->_vptr_section[5])();
    str_section_type<unsigned_int>(&local_58,uVar1);
    poVar3 = std::operator<<(poVar3,(string *)&local_58);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_68 = (int)std::setw(8);
    poVar3 = std::operator<<(poVar3,(_Setw)local_68);
    local_69 = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_69);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    iVar2 = (*_original_flags->_vptr_section[0x11])();
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,CONCAT44(extraout_var,iVar2));
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_70 = (int)std::setw(8);
    poVar3 = std::operator<<(poVar3,(_Setw)local_70);
    local_71 = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_71);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    iVar2 = (*_original_flags->_vptr_section[0x13])();
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,CONCAT44(extraout_var_00,iVar2));
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_78 = (int)std::setw(2);
    poVar3 = std::operator<<(poVar3,(_Setw)local_78);
    local_79 = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_79);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    iVar2 = (*_original_flags->_vptr_section[0xf])();
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,CONCAT44(extraout_var_01,iVar2));
    poVar3 = std::operator<<(poVar3," ");
    local_80 = (int)std::setw(3);
    poVar3 = std::operator<<(poVar3,(_Setw)local_80);
    local_81 = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_81);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::left);
    iVar2 = (*_original_flags->_vptr_section[7])();
    section_flags_abi_cxx11_(&local_a8,(dump *)CONCAT44(extraout_var_02,iVar2),flags);
    poVar3 = std::operator<<(poVar3,(string *)&local_a8);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_ac = (int)std::setw(2);
    poVar3 = std::operator<<(poVar3,(_Setw)local_ac);
    local_ad = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_ad);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    uVar1 = (*_original_flags->_vptr_section[0xb])();
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,uVar1);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_b4 = (int)std::setw(3);
    poVar3 = std::operator<<(poVar3,(_Setw)local_b4);
    local_b5 = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_b5);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    uVar1 = (*_original_flags->_vptr_section[9])();
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,uVar1);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_bc = (int)std::setw(2);
    poVar3 = std::operator<<(poVar3,(_Setw)local_bc);
    local_bd = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_bd);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    iVar2 = (*_original_flags->_vptr_section[0xd])();
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,CONCAT44(extraout_var_03,iVar2));
    poVar3 = std::operator<<(poVar3," ");
    local_c4 = (int)std::setw(0x11);
    poVar3 = std::operator<<(poVar3,(_Setw)local_c4);
    local_c5 = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_c5);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::left);
    (*_original_flags->_vptr_section[3])(local_e8);
    poVar3 = std::operator<<(poVar3,local_e8);
    poVar3 = std::operator<<(poVar3," ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    poVar3 = std::operator<<(poStack_10,"[");
    local_ec = (int)std::setw(5);
    poVar3 = std::operator<<(poVar3,(_Setw)local_ec);
    local_ed = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_ed);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,sec_local._6_2_);
    poVar3 = std::operator<<(poVar3,"] ");
    local_f4 = (int)std::setw(0x11);
    poVar3 = std::operator<<(poVar3,(_Setw)local_f4);
    local_f5 = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_f5);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::left);
    uVar1 = (*_original_flags->_vptr_section[5])();
    str_section_type<unsigned_int>(&local_118,uVar1);
    poVar3 = std::operator<<(poVar3,(string *)&local_118);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_11c = (int)std::setw(0x10);
    poVar3 = std::operator<<(poVar3,(_Setw)local_11c);
    local_11d = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_11d);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    iVar2 = (*_original_flags->_vptr_section[0x11])();
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,CONCAT44(extraout_var_04,iVar2));
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_124 = (int)std::setw(0x10);
    poVar3 = std::operator<<(poVar3,(_Setw)local_124);
    local_125 = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_125);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    iVar2 = (*_original_flags->_vptr_section[0x13])();
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,CONCAT44(extraout_var_05,iVar2));
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_12c = (int)std::setw(8);
    poVar3 = std::operator<<(poVar3,(_Setw)local_12c);
    local_12d = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_12d);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    iVar2 = (*_original_flags->_vptr_section[0x17])();
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,CONCAT44(extraout_var_06,iVar2));
    poVar3 = std::operator<<(poVar3," ");
    local_134 = (int)std::setw(3);
    poVar3 = std::operator<<(poVar3,(_Setw)local_134);
    local_135 = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_135);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::left);
    iVar2 = (*_original_flags->_vptr_section[7])();
    section_flags_abi_cxx11_(&local_158,(dump *)CONCAT44(extraout_var_07,iVar2),flags_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_158);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_15c = (int)std::setw(8);
    poVar3 = std::operator<<(poVar3,(_Setw)local_15c);
    local_15d = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_15d);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::left);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_164 = (int)std::setw(4);
    poVar3 = std::operator<<(poVar3,(_Setw)local_164);
    local_165 = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_165);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    iVar2 = (*_original_flags->_vptr_section[0xf])();
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,CONCAT44(extraout_var_08,iVar2));
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_16c = (int)std::setw(4);
    poVar3 = std::operator<<(poVar3,(_Setw)local_16c);
    local_16d = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_16d);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    uVar1 = (*_original_flags->_vptr_section[0xb])();
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,uVar1);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_174 = (int)std::setw(4);
    poVar3 = std::operator<<(poVar3,(_Setw)local_174);
    local_175 = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_175);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    uVar1 = (*_original_flags->_vptr_section[9])();
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,uVar1);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_17c = (int)std::setw(4);
    poVar3 = std::operator<<(poVar3,(_Setw)local_17c);
    local_17d = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_17d);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    iVar2 = (*_original_flags->_vptr_section[0xd])();
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,CONCAT44(extraout_var_09,iVar2));
    poVar3 = std::operator<<(poVar3,"   ");
    local_184 = (int)std::setw(0x11);
    poVar3 = std::operator<<(poVar3,(_Setw)local_184);
    local_185 = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_185);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::left);
    (*_original_flags->_vptr_section[3])(local_1a8);
    poVar3 = std::operator<<(poVar3,local_1a8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_118);
  }
  std::ios_base::flags((ios_base *)(poStack_10 + *(long *)(*(long *)poStack_10 + -0x18)),local_28);
  return;
}

Assistant:

static void section_header( std::ostream&  out,
                                Elf_Half       no,
                                const section* sec,
                                unsigned char  elf_class )
    {
        std::ios_base::fmtflags original_flags = out.flags();

        // clang-format off
        if ( elf_class == ELFCLASS32 ) { // Output for 32-bit
            out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
                << DUMP_STR_FORMAT( 17 ) << str_section_type( sec->get_type() )
                << " " << DUMP_HEX0x_FORMAT( 8 ) << sec->get_address() << " "
                << DUMP_HEX0x_FORMAT( 8 ) << sec->get_size() << " "
                << DUMP_HEX0x_FORMAT( 2 ) << sec->get_entry_size() << " "
                << DUMP_STR_FORMAT( 3 ) << section_flags( sec->get_flags() )
                << " " << DUMP_HEX0x_FORMAT( 2 ) << sec->get_link() << " "
                << DUMP_HEX0x_FORMAT( 3 ) << sec->get_info() << " "
                << DUMP_HEX0x_FORMAT( 2 ) << sec->get_addr_align() << " "
                << DUMP_STR_FORMAT( 17 ) << sec->get_name() << " " << std::endl;
        }
        else { // Output for 64-bit
            out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
                << DUMP_STR_FORMAT( 17 ) << str_section_type( sec->get_type() ) << " "
                << DUMP_HEX0x_FORMAT( 16 ) << sec->get_address()                  << " "
                << DUMP_HEX0x_FORMAT( 16 ) << sec->get_size()                     << " "
                << DUMP_HEX0x_FORMAT(  8 ) << sec->get_offset()                   << " "
                << DUMP_STR_FORMAT(  3) << section_flags( sec->get_flags() )
                << std::endl
                << DUMP_STR_FORMAT( 8 ) << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_entry_size() << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_link()       << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_info()       << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_addr_align() << "   "
                << DUMP_STR_FORMAT( 17 ) << sec->get_name()
                << std::endl;
        }
        // clang-format on

        out.flags( original_flags );

        return;
    }